

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O1

void __thiscall
pbrt::GBufferFilm::GBufferFilm
          (GBufferFilm *this,FilmBaseParameters *p,RGBColorSpace *colorSpace,Float maxComponentValue
          ,bool writeFP16,Allocator alloc)

{
  float fVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  ulong uVar5;
  PixelSensor *pPVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  short sVar10;
  undefined1 (*pauVar11) [64];
  int iVar12;
  long lVar13;
  int iVar14;
  SquareMatrix<3> *pSVar15;
  GaussianFilter *this_00;
  PixelSensor *pPVar16;
  long lVar17;
  PixelSensor *pPVar18;
  int k;
  long lVar19;
  long in_FS_OFFSET;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  float fVar24;
  SquareMatrix<3> r;
  undefined1 auStack_a8 [8];
  Float local_a0;
  Float local_9c [9];
  undefined1 auStack_78 [48];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  auStack_78._16_8_ = (p->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>;
  auStack_78._0_8_ = (p->fullResolution).super_Tuple2<pbrt::Point2,_int>;
  auStack_78._8_8_ = (p->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>;
  auStack_78._24_8_ =
       (p->filter).
       super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
       .bits;
  auStack_78._32_4_ = p->diagonal;
  auStack_78._36_4_ = *(undefined4 *)&p->field_0x24;
  auStack_78._40_8_ = p->sensor;
  pcVar4 = (p->filename)._M_dataplus._M_p;
  local_a0 = maxComponentValue;
  local_48._M_p = (pointer)&local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar4,pcVar4 + (p->filename)._M_string_length);
  FilmBase::FilmBase(&this->super_FilmBase,(FilmBaseParameters *)auStack_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  Array2D<pbrt::GBufferFilm::Pixel>::Array2D
            (&this->pixels,&(this->super_FilmBase).pixelBounds,(allocator_type)alloc.memoryResource)
  ;
  this->colorSpace = colorSpace;
  this->maxComponentValue = local_a0;
  this->writeFP16 = writeFP16;
  uVar5 = (this->super_FilmBase).filter.
          super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
          .bits;
  this_00 = (GaussianFilter *)(uVar5 & 0xffffffffffff);
  sVar10 = (short)(uVar5 >> 0x30);
  if (uVar5 >> 0x30 < 3) {
    if (sVar10 == 2) {
      fVar24 = GaussianFilter::Integral(this_00);
    }
    else {
      fVar24 = (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.x;
      fVar24 = fVar24 + fVar24;
      fVar24 = (fVar24 + fVar24) * (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.y;
    }
  }
  else if (uVar5 >> 0x30 == 4) {
    fVar24 = LanczosSincFilter::Integral((LanczosSincFilter *)this_00);
  }
  else if (sVar10 == 3) {
    fVar24 = (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.x *
             (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.y * 0.25;
  }
  else {
    fVar1 = (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.x;
    fVar24 = (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.y;
    fVar24 = fVar24 * fVar1 * fVar1 * fVar24;
  }
  this->filterIntegral = fVar24;
  lVar13 = 0;
  auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  pSVar15 = &this->outputRGBFromSensorRGB;
  do {
    auVar22 = vpbroadcastq_avx512f();
    uVar7 = vpcmpeqq_avx512f(auVar22,auVar20);
    uVar8 = vpcmpeqq_avx512f(auVar22,auVar21);
    auVar22 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar8,(char)uVar7));
    auVar22 = vpsrld_avx512f(auVar22,0x1f);
    auVar22 = vcvtdq2ps_avx512f(auVar22);
    auVar22._12_4_ = pSVar15->m[1][0];
    auVar22._16_4_ = pSVar15->m[1][1];
    auVar22._20_4_ = pSVar15->m[1][2];
    auVar22._24_4_ = pSVar15->m[2][0];
    auVar22._28_4_ = pSVar15->m[2][1];
    auVar22._32_4_ = pSVar15->m[2][2];
    auVar22._36_4_ = *(undefined4 *)(pSVar15 + 1);
    auVar22._40_4_ = *(undefined4 *)((long)(pSVar15 + 1) + 4);
    auVar22._44_4_ = *(undefined4 *)((long)(pSVar15 + 1) + 8);
    auVar22._48_4_ = *(undefined4 *)((long)(pSVar15 + 1) + 0xc);
    auVar22._52_4_ = *(undefined4 *)((long)(pSVar15 + 1) + 0x10);
    auVar22._56_4_ = *(undefined4 *)((long)(pSVar15 + 1) + 0x14);
    auVar22._60_4_ = *(undefined4 *)((long)(pSVar15 + 1) + 0x18);
    *(undefined1 (*) [64])pSVar15 = auVar22;
    lVar13 = lVar13 + 1;
    pSVar15 = (SquareMatrix<3> *)(pSVar15->m + 1);
  } while (lVar13 != 3);
  iVar2 = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.x;
  iVar3 = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar12 = iVar2 - iVar3;
  if ((iVar12 != 0 && iVar3 <= iVar2) &&
     (iVar2 = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.y,
     iVar3 = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.y,
     iVar14 = iVar2 - iVar3, iVar14 != 0 && iVar3 <= iVar2)) {
    *(long *)(in_FS_OFFSET + -1000) =
         *(long *)(in_FS_OFFSET + -1000) + (long)(iVar14 * iVar12) * 0xb0;
    pPVar6 = (this->super_FilmBase).sensor;
    lVar13 = 0;
    pauVar11 = (undefined1 (*) [64])auStack_a8;
    do {
      auVar22 = vpbroadcastq_avx512f();
      uVar7 = vpcmpeqq_avx512f(auVar22,auVar20);
      uVar8 = vpcmpeqq_avx512f(auVar22,auVar21);
      auVar22 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar8,(char)uVar7));
      auVar22 = vpsrld_avx512f(auVar22,0x1f);
      auVar22 = vcvtdq2ps_avx512f(auVar22);
      auVar23._0_12_ = auVar22._0_12_;
      auVar23._12_4_ = *(undefined4 *)(*pauVar11 + 0x18);
      auVar23._16_4_ = *(undefined4 *)(*pauVar11 + 0x1c);
      auVar23._20_4_ = *(undefined4 *)(*pauVar11 + 0x20);
      auVar23._24_4_ = *(undefined4 *)(*pauVar11 + 0x24);
      auVar23._28_4_ = *(undefined4 *)(*pauVar11 + 0x28);
      auVar23._32_4_ = *(undefined4 *)(*pauVar11 + 0x2c);
      auVar23._36_4_ = *(undefined4 *)(*pauVar11 + 0x30);
      auVar23._40_4_ = *(undefined4 *)(*pauVar11 + 0x34);
      auVar23._44_4_ = *(undefined4 *)(*pauVar11 + 0x38);
      auVar23._48_4_ = *(undefined4 *)(*pauVar11 + 0x3c);
      auVar23._52_4_ = *(undefined4 *)pauVar11[1];
      auVar23._56_4_ = *(undefined4 *)(pauVar11[1] + 4);
      auVar23._60_4_ = *(undefined4 *)(pauVar11[1] + 8);
      *(undefined1 (*) [64])(*pauVar11 + 0xc) = auVar23;
      lVar13 = lVar13 + 1;
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0xc);
    } while (lVar13 != 3);
    pSVar15 = &colorSpace->RGBFromXYZ;
    lVar13 = 0;
    do {
      lVar17 = 0;
      pPVar16 = pPVar6;
      do {
        local_9c[lVar13 * 3 + lVar17] = 0.0;
        auVar20 = ZEXT1664((undefined1  [16])0x0);
        lVar19 = 0;
        pPVar18 = pPVar16;
        do {
          auVar9 = vfmadd231ss_fma(auVar20._0_16_,ZEXT416((uint)pSVar15->m[0][lVar19]),
                                   ZEXT416((uint)(pPVar18->XYZFromSensorRGB).m[0][0]));
          auVar20 = ZEXT1664(auVar9);
          lVar19 = lVar19 + 1;
          pPVar18 = (PixelSensor *)((pPVar18->XYZFromSensorRGB).m + 1);
        } while (lVar19 != 3);
        local_9c[lVar13 * 3 + lVar17] = auVar9._0_4_;
        lVar17 = lVar17 + 1;
        pPVar16 = (PixelSensor *)((pPVar16->XYZFromSensorRGB).m[0] + 1);
      } while (lVar17 != 3);
      lVar13 = lVar13 + 1;
      pSVar15 = (SquareMatrix<3> *)(pSVar15->m + 1);
    } while (lVar13 != 3);
    (this->outputRGBFromSensorRGB).m[2][2] = local_9c[8];
    *(undefined8 *)(this->outputRGBFromSensorRGB).m[0] = local_9c._0_8_;
    *(undefined8 *)((this->outputRGBFromSensorRGB).m[0] + 2) = local_9c._8_8_;
    *(undefined8 *)((this->outputRGBFromSensorRGB).m[1] + 1) = local_9c._16_8_;
    *(undefined8 *)(this->outputRGBFromSensorRGB).m[2] = local_9c._24_8_;
    return;
  }
  LogFatal<char_const(&)[23]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
             ,0x27a,"Check failed: %s",(char (*) [23])"!pixelBounds.IsEmpty()");
}

Assistant:

GBufferFilm::GBufferFilm(FilmBaseParameters p, const RGBColorSpace *colorSpace,
                         Float maxComponentValue, bool writeFP16, Allocator alloc)
    : FilmBase(p),
      pixels(pixelBounds, alloc),
      colorSpace(colorSpace),
      maxComponentValue(maxComponentValue),
      writeFP16(writeFP16),
      filterIntegral(filter.Integral()) {
    CHECK(!pixelBounds.IsEmpty());
    filmPixelMemory += pixelBounds.Area() * sizeof(Pixel);
    outputRGBFromSensorRGB = colorSpace->RGBFromXYZ * sensor->XYZFromSensorRGB;
}